

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::predict_or_learn<true>(csoaa *c,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  float *pfVar5;
  wclass *pwVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  feature_index i;
  features *pfVar10;
  uint uVar11;
  wclass *__begin3;
  wclass *pwVar12;
  unsigned_long uVar13;
  float fVar14;
  float local_60;
  uint local_5c;
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  pwVar6 = (ec->l).cs.costs.end_array;
  sVar7 = (ec->l).cs.costs.erase_count;
  pfVar10 = ec->passthrough;
  if (pfVar10 == (features *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (long)(pfVar10->values)._end - (long)(pfVar10->values)._begin >> 2;
  }
  (ec->l).cs.costs._begin = (wclass *)0x0;
  (ec->l).simple.initial = 0.0;
  if (pwVar4 == pwVar3) {
    if (c->num_classes == 0) {
      local_5c = 1;
    }
    else {
      fVar14 = 3.4028235e+38;
      uVar11 = 1;
      local_5c = 1;
      do {
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * (uVar11 - 1));
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)((uVar11 - 1) * *(int *)(base + 0xe0));
        fVar2 = ec->partial_prediction;
        if ((fVar2 < fVar14) || (uVar11 < local_5c && fVar2 == fVar14)) {
          fVar14 = fVar2;
          local_5c = uVar11;
        }
        if (ec->passthrough != (features *)0x0) {
          features::push_back(ec->passthrough,fVar2,(ulong)uVar11 ^ 0x398d9fda640553);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 <= c->num_classes);
    }
  }
  else {
    local_5c = 1;
    local_60 = 3.4028235e+38;
    pwVar12 = pwVar3;
    do {
      uVar11 = pwVar12->class_index;
      fVar14 = pwVar12->x;
      ec->weight = (float)(~-(uint)(fVar14 == 3.4028235e+38) & 0x3f800000);
      (ec->l).simple.label = fVar14;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * (uVar11 - 1));
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)((uVar11 - 1) * *(int *)(base + 0xe0));
      pwVar12->partial_prediction = ec->partial_prediction;
      fVar14 = ec->partial_prediction;
      if (fVar14 < local_60) {
LAB_002640ef:
        local_60 = fVar14;
        local_5c = uVar11;
      }
      else if (((fVar14 == local_60) && (!NAN(fVar14) && !NAN(local_60))) && (uVar11 < local_5c))
      goto LAB_002640ef;
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,fVar14,(ulong)uVar11 ^ 0x398d9fda640553);
      }
      pwVar12 = pwVar12 + 1;
    } while (pwVar12 != pwVar4);
    ec->partial_prediction = local_60;
  }
  pfVar10 = ec->passthrough;
  if (pfVar10 != (features *)0x0) {
    pfVar5 = (pfVar10->values)._begin;
    lVar8 = (long)(pfVar10->values)._end - (long)pfVar5 >> 2;
    if (lVar8 == lVar9) {
      i = 0x398d9fdb078fea;
      fVar14 = 3.4028235e+38;
    }
    else {
      fVar14 = 3.4028235e+38;
      uVar13 = 0;
      do {
        fVar2 = pfVar5[lVar9];
        if ((ec->partial_prediction < fVar2) && (fVar2 < fVar14)) {
          uVar13 = (pfVar10->indicies)._begin[lVar9];
          fVar14 = fVar2;
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
      i = uVar13 + 0x1638ab9 ^ 0x398d9fda640553;
    }
    if (3.4028235e+38 <= fVar14) {
      i = 0x398d9fd8715547;
    }
    else {
      features::push_back(pfVar10,fVar14 - ec->partial_prediction,0x398d9fdb078feb);
      pfVar10 = ec->passthrough;
      if (pfVar10 == (features *)0x0) goto LAB_00264300;
    }
    features::push_back(pfVar10,1.0,i);
  }
LAB_00264300:
  (ec->pred).multiclass = local_5c;
  (ec->l).cs.costs._begin = pwVar3;
  (ec->l).cs.costs._end = pwVar4;
  (ec->l).cs.costs.end_array = pwVar6;
  (ec->l).cs.costs.erase_count = sVar7;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}